

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDataflow_cpp.h
# Opt level: O0

u32 __thiscall moira::Moira::readM<(moira::MemSpace)2,(moira::Size)2,4ul>(Moira *this,u32 addr)

{
  bool bVar1;
  uint uVar2;
  uint in_ESI;
  Moira *in_RDI;
  u32 result;
  undefined4 in_stack_fffffffffffffff0;
  
  setFC(in_RDI,FC_USER_PROG);
  if (((in_RDI->flags & 0x8000U) != 0) &&
     (bVar1 = Debugger::watchpointMatches
                        ((Debugger *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                         (u32)((ulong)in_RDI >> 0x20),(Size)in_RDI), bVar1)) {
    (*in_RDI->_vptr_Moira[0x18])(in_RDI,(ulong)in_ESI);
  }
  (*in_RDI->_vptr_Moira[0x19])(in_RDI,2);
  pollIrq(in_RDI);
  uVar2 = (*in_RDI->_vptr_Moira[3])(in_RDI,(ulong)(in_ESI & 0xffffff));
  uVar2 = uVar2 & 0xffff;
  (*in_RDI->_vptr_Moira[0x19])(in_RDI,2);
  return uVar2;
}

Assistant:

u32
Moira::readM(u32 addr)
{
    u32 result;
        
    // Break down long word accesses into two word accesses
    if (S == Long) {
        result = readM<M, Word>(addr) << 16;
        result |= readM<M, Word, F>(addr + 2);
        return result;
    }
    
    // Update function code pins
    setFC(M == MEM_DATA ? FC_USER_DATA : FC_USER_PROG);

    // Check if a watchpoint is being accessed
    if ((flags & CPU_CHECK_WP) && debugger.watchpointMatches(addr, S)) {
        watchpointReached(addr);
    }
    
    // Perform the read operation
    sync(2);
    if (F & POLLIPL) pollIrq();
    result = (S == Byte) ? read8(addr & 0xFFFFFF) : read16(addr & 0xFFFFFF);
    sync(2);
    
    return result;
}